

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O0

bool __thiscall flatbuffers::TSGRPCGenerator::generate(TSGRPCGenerator *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  pointer pSVar4;
  char *pcVar5;
  string local_120;
  undefined1 local_100 [8];
  string ts_interface_name;
  string local_b8;
  undefined1 local_98 [8];
  string ts_name;
  undefined1 local_48 [8];
  unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
  service;
  int i;
  FlatBufFile file;
  TSGRPCGenerator *this_local;
  
  file._24_8_ = this;
  CodeWriter::Clear(&this->code_);
  FlatBufFile::FlatBufFile
            ((FlatBufFile *)&stack0xffffffffffffffc8,(this->super_BaseGenerator).parser_,
             (this->super_BaseGenerator).file_name_,kLanguageTS);
  for (service._M_t.
       super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
       .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._4_4_ = 0;
      iVar1 = service._M_t.
              super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
              .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._4_4_,
      iVar3 = FlatBufFile::service_count((FlatBufFile *)&stack0xffffffffffffffc8), iVar1 < iVar3;
      service._M_t.
      super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
      .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._4_4_ =
           service._M_t.
           super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
           .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._4_4_ + 1) {
    FlatBufFile::service((FlatBufFile *)local_48,(int)&stack0xffffffffffffffc8);
    pSVar4 = std::
             unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
             ::get((unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
                    *)local_48);
    grpc_ts_generator::Generate
              ((string *)((long)&ts_name.field_2 + 8),(File *)&stack0xffffffffffffffc8,pSVar4,
               (this->super_BaseGenerator).file_name_);
    CodeWriter::operator+=(&this->code_,(string *)((long)&ts_name.field_2 + 8));
    std::__cxx11::string::~string((string *)(ts_name.field_2._M_local_buf + 8));
    GeneratedFileName((string *)local_98,(this->super_BaseGenerator).path_,
                      (this->super_BaseGenerator).file_name_,false);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    CodeWriter::ToString_abi_cxx11_(&local_b8,&this->code_);
    bVar2 = SaveFile(pcVar5,&local_b8,false);
    std::__cxx11::string::~string((string *)&local_b8);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      CodeWriter::Clear(&this->code_);
      pSVar4 = std::
               unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
               ::get((unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
                      *)local_48);
      grpc_ts_generator::GenerateInterface
                ((string *)((long)&ts_interface_name.field_2 + 8),(File *)&stack0xffffffffffffffc8,
                 pSVar4,(this->super_BaseGenerator).file_name_);
      CodeWriter::operator+=(&this->code_,(string *)((long)&ts_interface_name.field_2 + 8));
      std::__cxx11::string::~string((string *)(ts_interface_name.field_2._M_local_buf + 8));
      GeneratedFileName((string *)local_100,(this->super_BaseGenerator).path_,
                        (this->super_BaseGenerator).file_name_,true);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      CodeWriter::ToString_abi_cxx11_(&local_120,&this->code_);
      bVar2 = SaveFile(pcVar5,&local_120,false);
      std::__cxx11::string::~string((string *)&local_120);
      bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
      if (bVar2) {
        this_local._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)local_100);
    }
    else {
      this_local._7_1_ = 0;
      bVar2 = true;
    }
    std::__cxx11::string::~string((string *)local_98);
    std::
    unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>::
    ~unique_ptr((unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
                 *)local_48);
    if (bVar2) goto LAB_00358079;
  }
  this_local._7_1_ = 1;
LAB_00358079:
  FlatBufFile::~FlatBufFile((FlatBufFile *)&stack0xffffffffffffffc8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool generate() {
    code_.Clear();
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageTS);

    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      code_ += grpc_ts_generator::Generate(&file, service.get(), file_name_);
      const auto ts_name = GeneratedFileName(path_, file_name_);
      if (!SaveFile(ts_name.c_str(), code_.ToString(), false)) return false;

      code_.Clear();
      code_ += grpc_ts_generator::GenerateInterface(&file, service.get(),
                                                    file_name_);
      const auto ts_interface_name = GeneratedFileName(path_, file_name_, true);
      if (!SaveFile(ts_interface_name.c_str(), code_.ToString(), false))
        return false;
    }
    return true;
  }